

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int32_t zng_inflateGetHeader(zng_stream *strm,zng_gz_headerp head)

{
  internal_state *piVar1;
  int iVar2;
  long in_RSI;
  zng_stream *in_RDI;
  inflate_state *state;
  int32_t local_4;
  
  iVar2 = inflateStateCheck(in_RDI);
  if (iVar2 == 0) {
    piVar1 = in_RDI->state;
    if (((ulong)piVar1->pending_out & 2) == 0) {
      local_4 = -2;
    }
    else {
      piVar1->status = (int)in_RSI;
      piVar1->last_flush = (int)((ulong)in_RSI >> 0x20);
      *(undefined4 *)(in_RSI + 0x48) = 0;
      local_4 = 0;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateGetHeader)(PREFIX3(stream) *strm, PREFIX(gz_headerp) head) {
    struct inflate_state *state;

    /* check state */
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    if ((state->wrap & 2) == 0)
        return Z_STREAM_ERROR;

    /* save header structure */
    state->head = head;
    head->done = 0;
    return Z_OK;
}